

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

SQClass * SQClass::Create(SQVM *v,SQClass *base)

{
  bool bVar1;
  SQClass *in_RSI;
  SQClass *newclass;
  SQVM *in_stack_00000030;
  SQClass *in_stack_00000038;
  SQClass *in_stack_00000060;
  SQVM *in_stack_00000068;
  SQClass *in_stack_00000070;
  SQUnsignedInteger in_stack_ffffffffffffffd8;
  SQAllocContext in_stack_ffffffffffffffe0;
  SQClass *local_8;
  
  if (((in_RSI == (SQClass *)0x0) || (bVar1 = isLocked(in_RSI), bVar1)) ||
     (bVar1 = Lock(in_stack_00000038,in_stack_00000030), bVar1)) {
    local_8 = (SQClass *)sq_vm_malloc(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    SQClass(in_stack_00000070,in_stack_00000068,in_stack_00000060);
  }
  else {
    local_8 = (SQClass *)0x0;
  }
  return local_8;
}

Assistant:

SQClass* SQClass::Create(SQVM *v,SQClass *base)
{
    if (base && !base->isLocked()) {
        if (!base->Lock(v))
            return nullptr;
    }

    SQClass *newclass = (SQClass *)SQ_MALLOC(_ss(v)->_alloc_ctx, sizeof(SQClass));
    new (newclass) SQClass(v, base);
    return newclass;
}